

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O3

LPCSTR NpyArray::ParseHeaderNPY
                 (uint8_t *buffer,shape_t *shape,size_t *wordSize,char *type,bool *fortranOrder)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  string header;
  string local_50;
  
  pcVar4 = "error: invalid header id";
  if (*buffer == 0x93) {
    iVar1 = strncmp((char *)(buffer + 1),"NUMPY",5);
    if (iVar1 == 0) {
      if (buffer[6] < 2) {
        uVar3 = (ulong)*(ushort *)(buffer + 8);
        lVar2 = 10;
      }
      else {
        uVar3 = (ulong)*(uint *)(buffer + 8);
        lVar2 = 0xc;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,buffer + lVar2,buffer + lVar2 + uVar3);
      pcVar4 = ParseHeaderNPY(&local_50,shape,wordSize,type,fortranOrder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  return pcVar4;
}

Assistant:

LPCSTR NpyArray::ParseHeaderNPY(const uint8_t* buffer, shape_t& shape, size_t& wordSize, char& type, bool& fortranOrder)
{
	if (buffer[0] != (uint8_t)0x93 || _tcsncmp(reinterpret_cast<const char*>(buffer+1), "NUMPY", 5) != 0)
		return "error: invalid header id";
	// parse the length of the header data
	uint32_t lenHeader, offset;
	ASSERT(buffer[7] >= 0); // minor version number of the file format
	if (buffer[6] > 1) { // major version number of the file format
		// little-endian unsigned int
		lenHeader = (uint32_t(buffer[11])<<24)|(uint32_t(buffer[10])<<16)|(uint32_t(buffer[9])<<8)|uint32_t(buffer[8]);
		offset = 12;
	} else {
		// little-endian unsigned short int
		lenHeader = (uint16_t(buffer[9])<<8)|uint16_t(buffer[8]);
		offset = 10;
	}
	const std::string header(reinterpret_cast<const char*>(buffer+offset), lenHeader);
	return ParseHeaderNPY(header, shape, wordSize, type, fortranOrder);
}